

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O3

void pop_activation_record_from_stack(CManager_conflict cm,ev_handler_activation_ptr rec)

{
  undefined8 *puVar1;
  long lVar2;
  pthread_t pVar3;
  long *plVar4;
  char *__s;
  
  pVar3 = pthread_self();
  plVar4 = (long *)(cm->context_lock).__align;
  if (plVar4 == (long *)0x0) {
    __s = "Activation stack inconsistency!  No records!";
LAB_00135653:
    puts(__s);
    return;
  }
  if (plVar4[1] == pVar3) {
    puVar1 = (undefined8 *)plVar4[3];
    (cm->context_lock).__align = (long)puVar1;
    if (puVar1 != (undefined8 *)0x0) {
      *puVar1 = 0;
    }
  }
  else {
    do {
      plVar4 = (long *)plVar4[3];
      if (plVar4 == (long *)0x0) {
        __s = "Activation stack inconsistency!  Record with thread ID now found!";
        goto LAB_00135653;
      }
    } while (plVar4[1] != pVar3);
    lVar2 = *plVar4;
    plVar4 = (long *)plVar4[3];
    *(long **)(lVar2 + 0x18) = plVar4;
    if (plVar4 != (long *)0x0) {
      *plVar4 = lVar2;
    }
  }
  return;
}

Assistant:

static void
pop_activation_record_from_stack(CManager cm, ev_handler_activation_ptr rec)
{
    event_path_data evp = cm->evp;
    ev_handler_activation_ptr tmp;
    thr_thread_id self = thr_thread_self();
    if (!evp->activation_stack) {
	printf("Activation stack inconsistency!  No records!\n"); 
	return;
    }
    if (evp->activation_stack->thread_id == self) {
	evp->activation_stack = evp->activation_stack->next;
	if (evp->activation_stack) {
	    evp->activation_stack->prev = NULL;
	}
	return;
    }
    tmp = evp->activation_stack->next;
    while(tmp) {
	if (tmp->thread_id == self) {
	    tmp->prev->next = tmp->next;
	    if (tmp->next) {
		tmp->next->prev = tmp->prev;
	    }
	    return;
	}
	tmp = tmp->next;
    }
    printf("Activation stack inconsistency!  Record with thread ID now found!\n"); 
}